

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_unbreakable(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  AFFECT_DATA af;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  undefined1 in_stack_000012b2;
  undefined1 in_stack_000012b3;
  int in_stack_000012b4;
  int in_stack_000012b8;
  int in_stack_000012bc;
  CHAR_DATA *in_stack_000012c0;
  CHAR_DATA *in_stack_000012c8;
  int in_stack_000012e8;
  int in_stack_000012f0;
  char *in_stack_000012f8;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar3;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  char *format;
  CHAR_DATA *local_28;
  
  local_28 = in_RCX;
  if (in_RCX == (CHAR_DATA *)0x0) {
    local_28 = in_RDX;
  }
  pOVar2 = get_eq_char(local_28,0x10);
  if (pOVar2 == (OBJ_DATA *)0x0) {
    if (local_28 == in_RDX) {
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
    }
    else {
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
    }
  }
  else {
    if (local_28 == in_RDX) {
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
    }
    else {
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
      act(in_stack_ffffffffffffff50,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
          (void *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
          (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
    }
    dice(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 1;
    format = "the intense cold*";
    damage_new(in_stack_000012c8,in_stack_000012c0,in_stack_000012bc,in_stack_000012b8,
               in_stack_000012b4,(bool)in_stack_000012b3,(bool)in_stack_000012b2,in_stack_000012e8,
               in_stack_000012f0,in_stack_000012f8);
    bVar1 = is_affected(local_28,(int)gsn_unbreakable);
    if (bVar1) {
      if (in_RDX == local_28) {
        send_to_char(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,uVar5));
      }
      else {
        act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,uVar5),
            (void *)CONCAT44(in_stack_ffffffffffffff44,uVar4),
            (void *)CONCAT44(in_stack_ffffffffffffff3c,uVar3),0);
        send_to_char(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,uVar5));
      }
    }
    else {
      init_affect((AFFECT_DATA *)0x6e4b9b);
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff44,uVar4),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff3c,uVar3));
    }
  }
  return;
}

Assistant:

void spell_unbreakable(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	AFFECT_DATA af;

	if (victim == nullptr)
		victim = ch;

	obj = get_eq_char(victim, WEAR_WIELD);

	if (obj)
	{
		if (victim == ch)
		{
			act("You painfully freeze your weapon to your hand!", ch, 0, victim, TO_CHAR);
			act("$n's fist turns a rigid white as $e grips $s weapon tightly.", ch, 0, 0, TO_ROOM);
		}
		else
		{
			act("You freeze $N's weapon to $S hand.", ch, 0, victim, TO_CHAR);
			act("$n painfully freezes your weapon to your hand!", ch, 0, victim, TO_VICT);
			act("$N's fist turns a rigid white as $E grips $S weapon tightly.", ch, 0, victim, TO_NOTVICT);
		}
	}
	else
	{
		if (victim == ch)
			act("You are not wielding a weapon!", ch, 0, 0, TO_CHAR);
		else
			act("$N is not wielding a weapon!", ch, 0, victim, TO_CHAR);

		return;
	}

	damage_new(ch, victim, dice(6, 9), TYPE_UNDEFINED, DAM_COLD, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the intense cold*");

	if (is_affected(victim, gsn_unbreakable))
	{
		if (ch == victim)
		{
			send_to_char("Your weapon is already frozen to your hand!\n\r", ch);
			return;
		}
		else
		{
			act("$N's weapon is already frozen to $S hand!", ch, 0, victim, TO_CHAR);
			send_to_char("Your weapon is already frozen to your hand!\n\r", victim);
			return;
		}
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_unbreakable;
	af.aftype = AFT_SPELL;
	af.owner = ch;
	af.modifier = 0;
	af.duration = level / 4;
	af.location = 0;
	af.level = level;
	affect_to_char(victim, &af);
}